

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O2

bool glu::isSizedFormatColorRenderable
               (RenderContext *renderCtx,ContextInfo *contextInfo,deUint32 sizedFormat)

{
  bool bVar1;
  uint uVar2;
  InternalError *this;
  char *name;
  allocator<char> local_39;
  string local_38;
  
  uVar2 = (*renderCtx->_vptr_RenderContext[2])();
  if ((uVar2 & 0x3ff) != 3) {
    this = (InternalError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Context type not supported in query",&local_39);
    tcu::InternalError::InternalError(this,&local_38);
    __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
  }
  uVar2 = sizedFormat - 0x8229;
  if (uVar2 < 0x14) {
    if ((0xfff05U >> (uVar2 & 0x1f) & 1) != 0) {
      return true;
    }
    if ((0x50U >> (uVar2 & 0x1f) & 1) != 0) {
LAB_004a31ae:
      bVar1 = ContextInfo::isExtensionSupported(contextInfo,"GL_EXT_color_buffer_float");
      if (bVar1) {
        return true;
      }
      name = "GL_EXT_color_buffer_half_float";
      goto LAB_004a31c8;
    }
    if ((0xa0U >> (uVar2 & 0x1f) & 1) == 0) goto LAB_004a30bc;
  }
  else {
LAB_004a30bc:
    if ((sizedFormat - 0x8d62 < 0x2d) &&
       ((0x104104104001U >> ((ulong)(sizedFormat - 0x8d62) & 0x3f) & 1) != 0)) {
      return true;
    }
    if ((sizedFormat - 0x8051 < 9) && ((0x1e1U >> (sizedFormat - 0x8051 & 0x1f) & 1) != 0)) {
      return true;
    }
    if (sizedFormat - 0x81a5 < 2) {
      return false;
    }
    if (sizedFormat != 0x8814) {
      if (sizedFormat == 0x881a) goto LAB_004a31ae;
      if (sizedFormat == 0x88f0) {
        return false;
      }
      if (sizedFormat == 0x906f) {
        return true;
      }
      if (sizedFormat == 0x8c43) {
        return true;
      }
      if (sizedFormat == 0x8cac) {
        return false;
      }
      if (sizedFormat == 0x8cad) {
        return false;
      }
      if (sizedFormat == 0x8d48) {
        return false;
      }
      if (sizedFormat != 0x8c3a) {
        return false;
      }
    }
  }
  name = "GL_EXT_color_buffer_float";
LAB_004a31c8:
  bVar1 = ContextInfo::isExtensionSupported(contextInfo,name);
  return bVar1;
}

Assistant:

bool isSizedFormatColorRenderable (const RenderContext& renderCtx, const ContextInfo& contextInfo, deUint32 sizedFormat)
{
	deUint32 renderable = 0;

	if (renderCtx.getType().getAPI() == ApiType::es(3,0))
		renderable = getRenderableBitsES3(contextInfo, sizedFormat);
	else
		throw tcu::InternalError("Context type not supported in query");

	return (renderable & RENDERABLE_COLOR) != 0;
}